

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O3

bool save_wav16(string *fname,vector<float,_std::allocator<float>_> *data,int sample_rate)

{
  float *pfVar1;
  common_log *log;
  float *sample;
  float *pfVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  int16_t pcm_sample;
  ofstream file;
  undefined2 local_24e;
  undefined4 local_24c;
  int local_248;
  undefined8 local_244;
  undefined8 local_23c;
  undefined8 local_234;
  undefined8 local_22c;
  int local_224;
  long local_220;
  filebuf local_218 [24];
  byte abStack_200 [216];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(string *)fname,_S_bin);
  if ((abStack_200[*(long *)(local_220 + -0x18)] & 5) == 0) {
    local_24c = 0x46464952;
    local_244 = 0x20746d6645564157;
    local_23c = 0x1000100000010;
    local_234 = 0xbb8000005dc0;
    local_22c = 0x6174616400100002;
    local_224 = (int)((ulong)((long)(data->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                   .super__Vector_impl_data._M_start) >> 1);
    local_248 = local_224 + 0x24;
    std::ostream::write((char *)&local_220,(long)&local_24c);
    pfVar2 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pfVar2 != pfVar1) {
      do {
        dVar4 = (double)*pfVar2 * 32767.0;
        dVar5 = 32767.0;
        if (dVar4 <= 32767.0) {
          dVar5 = dVar4;
        }
        local_24e = (undefined2)
                    (int)(double)(-(ulong)(dVar4 < -32768.0) & 0xc0e0000000000000 |
                                 ~-(ulong)(dVar4 < -32768.0) & (ulong)dVar5);
        std::ostream::write((char *)&local_220,(long)&local_24e);
        pfVar2 = pfVar2 + 1;
      } while (pfVar2 != pfVar1);
    }
    bVar3 = *(int *)(abStack_200 + *(long *)(local_220 + -0x18)) == 0;
  }
  else if (common_log_verbosity_thold < 0) {
    bVar3 = false;
  }
  else {
    log = common_log_main();
    bVar3 = false;
    common_log_add(log,GGML_LOG_LEVEL_ERROR,"%s: Failed to open file \'%s\' for writing.\n",
                   "save_wav16",(fname->_M_dataplus)._M_p);
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _ggml_backend_buft_name;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return bVar3;
}

Assistant:

static bool save_wav16(const std::string & fname, const std::vector<float> & data, int sample_rate) {
    std::ofstream file(fname, std::ios::binary);
    if (!file) {
        LOG_ERR("%s: Failed to open file '%s' for writing.\n", __func__, fname.c_str());
        return false;
    }

    wav_header header;
    header.sample_rate = sample_rate;
    header.byte_rate = header.sample_rate * header.num_channels * (header.bits_per_sample / 8);
    header.block_align = header.num_channels * (header.bits_per_sample / 8);
    header.data_size = data.size() * (header.bits_per_sample / 8);
    header.chunk_size = 36 + header.data_size;

    file.write(reinterpret_cast<const char*>(&header), sizeof(header));

    for (const auto & sample : data) {
        int16_t pcm_sample = static_cast<int16_t>(std::clamp(sample * 32767.0, -32768.0, 32767.0));
        file.write(reinterpret_cast<const char*>(&pcm_sample), sizeof(pcm_sample));
    }

    return file.good();
}